

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_chi2_test<trng::maxwell_dist<float>>(maxwell_dist<float> *d)

{
  double dVar1;
  long lVar2;
  int i;
  int iVar3;
  int i_1;
  result_type_conflict1 rVar4;
  parameter_type P;
  vector<float,_std::allocator<float>_> quantil;
  vector<int,_std::allocator<int>_> count;
  StringRef local_d8;
  vector<double,_std::allocator<double>_> p;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  StringRef local_40;
  SourceLineInfo local_30;
  
  quantil.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  quantil.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  quantil.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.macroName.m_start =
       (char *)((ulong)catchAssertionHandler.m_assertionInfo.macroName.m_start & 0xffffffff00000000)
  ;
  std::vector<int,_std::allocator<int>_>::vector
            (&count,0x80,(value_type_conflict *)&catchAssertionHandler,(allocator_type *)&R);
  for (iVar3 = 1; iVar3 != 0x80; iVar3 = iVar3 + 1) {
    rVar4 = trng::maxwell_dist<float>::icdf(d,(float)iVar3 * 0.0078125);
    catchAssertionHandler.m_assertionInfo.macroName.m_start =
         (char *)CONCAT44(catchAssertionHandler.m_assertionInfo.macroName.m_start._4_4_,rVar4);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&quantil,(float *)&catchAssertionHandler);
  }
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift(&R,P);
  for (iVar3 = 0; iVar3 != 10000; iVar3 = iVar3 + 1) {
    rVar4 = trng::maxwell_dist<float>::operator()(d,&R);
    for (lVar2 = 0;
        (lVar2 != 0x7f &&
        (quantil.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar2] <= rVar4 &&
         rVar4 != quantil.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar2])); lVar2 = lVar2 + 1) {
    }
    count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar2] = count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar2] + 1;
  }
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x3f80000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&p,0x80,(value_type_conflict6 *)&catchAssertionHandler,(allocator_type *)&local_d8);
  dVar1 = chi_percentil(&p,&count);
  local_d8.m_start = "REQUIRE";
  local_d8.m_size = 7;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_30.line = 0xc2;
  Catch::StringRef::StringRef(&local_40,"(0.01 < c2_p and c2_p < 0.99)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,&local_d8,&local_30,local_40,Normal);
  local_d8.m_start =
       (char *)(CONCAT71(local_d8.m_start._1_7_,-(dVar1 < 0.99) & -(0.01 < dVar1)) &
               0xffffffffffffff01);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&count.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&quantil.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}